

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O2

CURLcode getalnum(char **ptr,char *alpnbuf,size_t buflen)

{
  byte bVar1;
  CURLcode CVar2;
  byte *__src;
  ulong __n;
  
  __src = (byte *)*ptr;
  while( true ) {
    bVar1 = *__src;
    if ((bVar1 != 9) && (bVar1 != 0x20)) break;
    __src = __src + 1;
  }
  __n = 0;
  while ((0x3d < bVar1 || ((0x2800000100000201U >> ((ulong)bVar1 & 0x3f) & 1) == 0))) {
    bVar1 = __src[__n + 1];
    __n = __n + 1;
  }
  *ptr = (char *)(__src + __n);
  if (__n < buflen && __n != 0) {
    memcpy(alpnbuf,__src,__n);
    alpnbuf[__n] = '\0';
    CVar2 = CURLE_OK;
  }
  else {
    CVar2 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  return CVar2;
}

Assistant:

static CURLcode getalnum(const char **ptr, char *alpnbuf, size_t buflen)
{
  size_t len;
  const char *protop;
  const char *p = *ptr;
  while(*p && ISBLANK(*p))
    p++;
  protop = p;
  while(*p && !ISBLANK(*p) && (*p != ';') && (*p != '='))
    p++;
  len = p - protop;
  *ptr = p;

  if(!len || (len >= buflen))
    return CURLE_BAD_FUNCTION_ARGUMENT;
  memcpy(alpnbuf, protop, len);
  alpnbuf[len] = 0;
  return CURLE_OK;
}